

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

void borg_cheat_store(void)

{
  char cVar1;
  borg_shop *pbVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  object **list;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *__s;
  long lVar12;
  long lVar13;
  store_conflict *store;
  object *obj;
  char buf [120];
  long local_c0;
  long local_a8;
  short local_a0;
  
  list = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  if (z_info->store_max != 0) {
    lVar13 = 8;
    local_c0 = 0x68;
    uVar8 = 0;
    do {
      wVar3 = L'\0';
      store = stores + uVar8;
      if (z_info->store_inven_max != 0) {
        __s = borg_shops->ware[0].desc + lVar13 + -8;
        uVar10 = 0;
        do {
          memset(__s,0,0x388);
          uVar10 = uVar10 + 1;
          wVar3 = (wchar_t)z_info->store_inven_max;
          __s = __s + 0x388;
        } while (uVar10 < z_info->store_inven_max);
      }
      store_stock_list(store,list,wVar3);
      if ((z_info->store_inven_max != 0) && (obj = *list, obj != (object *)0x0)) {
        uVar10 = 1;
        lVar12 = local_c0;
        do {
          pbVar2 = borg_shops;
          object_desc((char *)&local_a8,0x78,obj,7,player);
          if (local_a0 == 0x29 && local_a8 == 0x676e6968746f6e28) break;
          borg_item_analyze((borg_item *)(pbVar2->ware[0].desc + lVar12 + -0x68),obj,
                            (char *)&local_a8,uVar8 != 7);
          if (uVar8 == 0) {
            cVar1 = pbVar2->ware[0].desc[lVar12 + -8];
            if (cVar1 == '\x13') {
              wVar3 = (wchar_t)borg_items[(ulong)z_info->pack_size + 5].sval;
              pwVar6 = &borg_fuel_onsale;
              pwVar7 = &sv_light_torch;
            }
            else if (cVar1 == '\x1b') {
              wVar3 = (wchar_t)borg_items[(ulong)z_info->pack_size + 5].sval;
              pwVar6 = &borg_fuel_onsale;
              pwVar7 = &sv_light_lantern;
            }
            else {
              if (cVar1 != '\x1c') goto LAB_001fd815;
              wVar3 = (wchar_t)(byte)pbVar2->ware[0].desc[lVar12 + -7];
              pwVar6 = &borg_food_onsale;
              pwVar7 = &sv_food_ration;
            }
            if (*pwVar7 == wVar3) {
              *pwVar6 = (uint)(byte)pbVar2->ware[0].desc[lVar12 + -4];
            }
          }
LAB_001fd815:
          iVar9 = 0;
          if (f_info[0xe].shopnum - 1 != uVar8) {
            tval_can_have_charges(obj);
            wVar3 = object_value_real(obj,L'\x01');
            wVar4 = object_value(obj,L'\x01');
            if (wVar4 < wVar3) {
              wVar3 = object_value(obj,L'\x01');
            }
            else {
              wVar3 = object_value_real(obj,L'\x01');
            }
            iVar9 = 0;
            if (L'\0' < wVar3) {
              iVar5 = 100;
              if (f_info[0xd].shopnum - 1 == uVar8) {
                iVar5 = 0x96;
              }
              tval_can_have_charges(obj);
              wVar3 = object_value_real(obj,L'\x01');
              iVar5 = (wVar3 << (f_info[0xd].shopnum - 1 == uVar8)) * iVar5;
              uVar11 = SUB168(SEXT816((long)iVar5 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) +
                       (long)iVar5 + 0x32;
              iVar9 = (int)(uVar11 >> 6) - (int)((long)uVar11 >> 0x3f);
              tval_can_have_charges(obj);
              if (iVar5 < 0x32) {
                iVar9 = 1;
              }
            }
          }
          *(int *)(pbVar2->ware[0].desc + lVar12 + 0x18) = iVar9;
          if (z_info->store_inven_max <= uVar10) break;
          obj = list[uVar10];
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + 0x388;
        } while (obj != (object *)0x0);
      }
      uVar8 = uVar8 + 1;
      lVar13 = lVar13 + 0x54c8;
      local_c0 = local_c0 + 0x54c8;
    } while (uVar8 < z_info->store_max);
  }
  mem_free(list);
  return;
}

Assistant:

void borg_cheat_store(void)
{
    int             slot, i;
    int             store_num;
    struct object*  o_ptr;
    struct object** list
        = mem_zalloc(sizeof(struct object*) * z_info->store_inven_max);

    /* Scan each store */
    for (store_num = 0; store_num < z_info->store_max; store_num++) {
        struct store* st_ptr = &stores[store_num];

        /* Clear the Inventory from memory */
        for (i = 0; i < z_info->store_inven_max; i++) {
            /* Wipe the ware */
            memset(&borg_shops[store_num].ware[i], 0, sizeof(borg_item));
        }

        store_stock_list(st_ptr, list, z_info->store_inven_max);

        /* Check each existing object in this store */
        for (slot = 0; slot < z_info->store_inven_max && list[slot]; slot++) {
            o_ptr             = list[slot];
            borg_item* b_item = &borg_shops[store_num].ware[slot];
            char       buf[120];

            /* Describe the item */
            object_desc(
                buf, sizeof(buf), o_ptr, ODESC_FULL | ODESC_STORE, player);
            if (streq(buf, "(nothing)"))
                break;

            /* Analyze the item */
            borg_item_analyze(
                b_item, o_ptr, buf, store_num == 7 ? false : true);

            /* Check if the general store has certain items */
            if (store_num == 0) {
                /* Food -- needed for money scumming */
                if (b_item->tval == TV_FOOD && b_item->sval == sv_food_ration)
                    borg_food_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_FLASK
                    && borg_items[INVEN_LIGHT].sval == sv_light_lantern)
                    borg_fuel_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_LIGHT
                    && borg_items[INVEN_LIGHT].sval == sv_light_torch)
                    borg_fuel_onsale = b_item->iqty;
            }

            /* Hack -- Save the declared cost */
            b_item->cost = borg_price_item(o_ptr, false, 1, store_num);
        }
    }
    mem_free(list);
}